

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::CallExpression::getEffectiveSignImpl(CallExpression *this,bool param_2)

{
  bool bVar1;
  __optional_eq_t<unsigned_int,_int> _Var2;
  SystemSubroutine *pSVar3;
  int *in_RDI;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *callInfo;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = isSystemCall((CallExpression *)0xa02360);
  if (bVar1) {
    std::get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
              ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                *)0xa02373);
    pSVar3 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                       ((not_null<const_slang::ast::SystemSubroutine_*> *)0xa02382);
    (*pSVar3->_vptr_SystemSubroutine[6])();
    in_stack_ffffffffffffffd4 = 1;
    _Var2 = std::operator==((optional<unsigned_int> *)CONCAT44(1,in_stack_ffffffffffffffd0),in_RDI);
    if (_Var2) {
      return Either;
    }
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa023c6);
  bVar1 = Type::isSigned((Type *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return (uint)bVar1;
}

Assistant:

Expression::EffectiveSign CallExpression::getEffectiveSignImpl(bool) const {
    if (isSystemCall()) {
        auto& callInfo = std::get<1>(subroutine);
        if (callInfo.subroutine->getEffectiveWidth() == 1)
            return EffectiveSign::Either;
    }
    return type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
}